

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1Input.cpp
# Opt level: O2

EStatusCode __thiscall
Type1Input::CalculateDependenciesForCharIndex
          (Type1Input *this,Byte inCharStringIndex,CharString1Dependencies *ioDependenciesInfo)

{
  EStatusCode EVar1;
  Type1CharString *inCharStringToIntepret;
  Trace *this_00;
  CharStringType1Interpreter interpreter;
  
  CharStringType1Interpreter::CharStringType1Interpreter(&interpreter);
  inCharStringToIntepret = GetGlyphCharString(this,inCharStringIndex);
  if (inCharStringToIntepret == (Type1CharString *)0x0) {
    this_00 = Trace::DefaultTrace();
    Trace::TraceToLog(this_00,
                      "Type1Input::CalculateDependenciesForCharIndex, Exception, cannot find glyph index"
                     );
    EVar1 = eFailure;
  }
  else {
    this->mCurrentDependencies = ioDependenciesInfo;
    EVar1 = CharStringType1Interpreter::Intepret
                      (&interpreter,inCharStringToIntepret,(IType1InterpreterImplementation *)this);
    this->mCurrentDependencies = (CharString1Dependencies *)0x0;
  }
  CharStringType1Interpreter::~CharStringType1Interpreter(&interpreter);
  return EVar1;
}

Assistant:

EStatusCode Type1Input::CalculateDependenciesForCharIndex(	Byte inCharStringIndex,
															CharString1Dependencies& ioDependenciesInfo)
{
	CharStringType1Interpreter interpreter;

	Type1CharString* charString = GetGlyphCharString(inCharStringIndex);
	if(!charString)
	{
		TRACE_LOG("Type1Input::CalculateDependenciesForCharIndex, Exception, cannot find glyph index");
		return eFailure;
	}

	mCurrentDependencies = &ioDependenciesInfo;
	EStatusCode status = interpreter.Intepret(*charString,this);
	mCurrentDependencies = NULL;
	return status;
}